

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameBase.cpp
# Opt level: O2

bool __thiscall
BayesianGameBase::AreCachedJointToIndivIndices(BayesianGameBase *this,PolicyDomainCategory pdc)

{
  E *this_00;
  
  if (pdc < STATE_INDEX) {
    return (bool)(1 >> ((byte)pdc & 7));
  }
  this_00 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_00,
       "Used a JointPolicyDiscrete::PolicyGlobals::PolicyDomainCategory unknown to BayesianGameBase!"
      );
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

bool BayesianGameBase::AreCachedJointToIndivIndices(
    const PolicyGlobals::PolicyDomainCategory pdc) const 
{
    switch ( pdc )
    {
    case PolicyGlobals::OHIST_INDEX :
        return CacheJointToIndivOH_Indices();
        break;
    case PolicyGlobals::AOHIST_INDEX :
        return CacheJointToIndivAOH_Indices();
        break;
    case PolicyGlobals::TYPE_INDEX : 
        return CacheJointToIndivType_Indices();
        break;
    default:
        throw(E("Used a JointPolicyDiscrete::PolicyGlobals::PolicyDomainCategory unknown to BayesianGameBase!"));
        break;
    }				/* -----  end switch  ----- */
}